

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# money.cpp
# Opt level: O3

Money * operator-(Money *__return_storage_ptr__,Money *lhs,Money *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  bool bVar10;
  long *local_f8;
  size_t local_f0;
  long local_e8;
  undefined8 uStack_e0;
  string local_d8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  double local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &local_d8.field_2;
  pcVar2 = (lhs->currency)._M_dataplus._M_p;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + (lhs->currency)._M_string_length);
  local_f8 = &local_e8;
  pcVar2 = (rhs->currency)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar2,pcVar2 + (rhs->currency)._M_string_length);
  plVar4 = local_f8;
  if (local_d8._M_string_length == local_f0) {
    if (local_d8._M_string_length == 0) {
      bVar10 = false;
    }
    else {
      iVar3 = bcmp(local_d8._M_dataplus._M_p,local_f8,local_d8._M_string_length);
      bVar10 = iVar3 != 0;
    }
  }
  else {
    bVar10 = true;
  }
  if (plVar4 != &local_e8) {
    operator_delete(plVar4,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar10) {
    local_98 = ((double)lhs->cents - (double)rhs->cents) / 100.0;
    pcVar2 = (lhs->currency)._M_dataplus._M_p;
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar2,pcVar2 + (lhs->currency)._M_string_length);
    Money::Money(__return_storage_ptr__,local_98,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  pcVar2 = (lhs->currency)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (lhs->currency)._M_string_length);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10416e);
  local_70 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_70 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b8 = (ulong *)*plVar4;
  puVar7 = (ulong *)(plVar4 + 2);
  if (local_b8 == puVar7) {
    local_a8 = *puVar7;
    uStack_a0 = (undefined4)plVar4[3];
    uStack_9c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar7;
  }
  local_b0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pcVar2 = (rhs->currency)._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (rhs->currency)._M_string_length);
  uVar9 = 0xf;
  if (local_b8 != &local_a8) {
    uVar9 = local_a8;
  }
  if (uVar9 < (ulong)(local_88 + local_b0)) {
    uVar9 = 0xf;
    if (local_90 != local_80) {
      uVar9 = local_80[0];
    }
    if ((ulong)(local_88 + local_b0) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b8);
      goto LAB_0010309e;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_90);
LAB_0010309e:
  local_f8 = (long *)*puVar5;
  plVar4 = puVar5 + 2;
  if (local_f8 == plVar4) {
    local_e8 = *plVar4;
    uStack_e0 = puVar5[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar4;
  }
  local_f0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_d8._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_d8._M_dataplus._M_p == psVar8) {
    local_d8.field_2._M_allocated_capacity = *psVar8;
    local_d8.field_2._8_8_ = plVar4[3];
    local_d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar8;
  }
  local_d8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  error(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Money operator-(const Money& lhs, const Money& rhs)
{
	if (lhs.get_currency() != rhs.get_currency())
	{
		error("Error in operator-() - Subtraction of '" 
			+ lhs.get_currency() + "' and '"
			+ rhs.get_currency() + "' is not defined.");
	}
	return Money{ (lhs.get_cents() - double(rhs.get_cents())) / 100.0, lhs.get_currency() };
}